

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cp_common.c
# Opt level: O2

void CP_dumpParams(SstStream Stream,_SstParams *Params,int ReaderSide)

{
  char *pcVar1;
  
  if (Stream->CPVerbosityLevel < 2) {
    return;
  }
  fprintf(_stderr,"Param -   RegistrationMethod=%s\n",
          SstRegStr_rel + *(int *)(SstRegStr_rel + Params->RegistrationMethod * 4));
  if (ReaderSide == 0) {
    fprintf(_stderr,"Param -   RendezvousReaderCount=%d\n",
            (ulong)(uint)Params->RendezvousReaderCount);
    pcVar1 = "";
    if (Params->QueueLimit == 0) {
      pcVar1 = "(unlimited)";
    }
    fprintf(_stderr,"Param -   QueueLimit=%d %s\n",(ulong)(uint)Params->QueueLimit,pcVar1);
    fprintf(_stderr,"Param -   QueueFullPolicy=%s\n",
            (long)&SstQueueFullStr_rel +
            (long)*(int *)((long)&SstQueueFullStr_rel + Params->QueueFullPolicy * 4));
    fprintf(_stderr,"Param -   StepDistributionMode=%s\n",
            SstStepDistributionModeStr_rel +
            *(int *)(SstStepDistributionModeStr_rel + Params->StepDistributionMode * 4));
  }
  pcVar1 = "";
  if (Params->DataTransport != (char *)0x0) {
    pcVar1 = Params->DataTransport;
  }
  fprintf(_stderr,"Param -   DataTransport=%s\n",pcVar1);
  fprintf(_stderr,"Param -   ControlTransport=%s\n",Params->ControlTransport);
  pcVar1 = "(default)";
  if (Params->NetworkInterface != (char *)0x0) {
    pcVar1 = Params->NetworkInterface;
  }
  fprintf(_stderr,"Param -   NetworkInterface=%s\n",pcVar1);
  pcVar1 = Params->ControlInterface;
  if (pcVar1 == (char *)0x0) {
    pcVar1 = "(default to NetworkInterface if applicable)";
  }
  fprintf(_stderr,"Param -   ControlInterface=%s\n",pcVar1);
  pcVar1 = Params->DataInterface;
  if (pcVar1 == (char *)0x0) {
    pcVar1 = "(default to NetworkInterface if applicable)";
  }
  fprintf(_stderr,"Param -   DataInterface=%s\n",pcVar1);
  if (ReaderSide == 0) {
    fprintf(_stderr,"Param -   CompressionMethod=%s\n",
            (long)&SstCompressStr_rel +
            (long)*(int *)((long)&SstCompressStr_rel + Params->CompressionMethod * 4));
    fprintf(_stderr,"Param -   CPCommPattern=%s\n",
            (long)&SstCommPatternStr_rel +
            (long)*(int *)((long)&SstCommPatternStr_rel + Params->CPCommPattern * 4));
    fprintf(_stderr,"Param -   MarshalMethod=%s\n",
            SstMarshalStr_rel + *(int *)(SstMarshalStr_rel + Params->MarshalMethod * 4));
    pcVar1 = "True";
    if (Params->FirstTimestepPrecious == 0) {
      pcVar1 = "False";
    }
    fprintf(_stderr,"Param -   FirstTimestepPrecious=%s\n",pcVar1);
    fprintf(_stderr,"Param -   IsRowMajor=%d  (not user settable) \n",
            (ulong)(uint)Params->IsRowMajor);
  }
  else {
    pcVar1 = "True";
    if (Params->AlwaysProvideLatestTimestep == 0) {
      pcVar1 = "False";
    }
    fprintf(_stderr,"Param -   AlwaysProvideLatestTimestep=%s\n",pcVar1);
  }
  fprintf(_stderr,"Param -   OpenTimeoutSecs=%d (seconds)\n",(ulong)(uint)Params->OpenTimeoutSecs);
  fprintf(_stderr,"Param -   SpeculativePreloadMode=%s\n",
          SstPreloadModeStr_rel +
          *(int *)(SstPreloadModeStr_rel + (long)Params->SpeculativePreloadMode * 4));
  fprintf(_stderr,"Param -   SpecAutoNodeThreshold=%d\n",(ulong)(uint)Params->SpecAutoNodeThreshold)
  ;
  pcVar1 = " (default - Advanced param)";
  if (Params->ControlModule != (char *)0x0) {
    pcVar1 = Params->ControlModule;
  }
  fprintf(_stderr,"Param -   ControlModule=%s\n",pcVar1);
  return;
}

Assistant:

extern void CP_dumpParams(SstStream Stream, struct _SstParams *Params, int ReaderSide)
{
    if (Stream->CPVerbosityLevel < SummaryVerbose)
        return;

    fprintf(stderr, "Param -   RegistrationMethod=%s\n", SstRegStr[Params->RegistrationMethod]);
    if (!ReaderSide)
    {
        fprintf(stderr, "Param -   RendezvousReaderCount=%d\n", Params->RendezvousReaderCount);
        fprintf(stderr, "Param -   QueueLimit=%d %s\n", Params->QueueLimit,
                (Params->QueueLimit == 0) ? "(unlimited)" : "");
        fprintf(stderr, "Param -   QueueFullPolicy=%s\n", SstQueueFullStr[Params->QueueFullPolicy]);
        fprintf(stderr, "Param -   StepDistributionMode=%s\n",
                SstStepDistributionModeStr[Params->StepDistributionMode]);
    }
    fprintf(stderr, "Param -   DataTransport=%s\n",
            Params->DataTransport ? Params->DataTransport : "");
    fprintf(stderr, "Param -   ControlTransport=%s\n", Params->ControlTransport);
    fprintf(stderr, "Param -   NetworkInterface=%s\n",
            Params->NetworkInterface ? Params->NetworkInterface : "(default)");
    fprintf(stderr, "Param -   ControlInterface=%s\n",
            Params->ControlInterface ? Params->ControlInterface
                                     : "(default to NetworkInterface if applicable)");
    fprintf(stderr, "Param -   DataInterface=%s\n",
            Params->DataInterface ? Params->DataInterface
                                  : "(default to NetworkInterface if applicable)");
    if (!ReaderSide)
    {
        fprintf(stderr, "Param -   CompressionMethod=%s\n",
                SstCompressStr[Params->CompressionMethod]);
        fprintf(stderr, "Param -   CPCommPattern=%s\n", SstCommPatternStr[Params->CPCommPattern]);
        fprintf(stderr, "Param -   MarshalMethod=%s\n", SstMarshalStr[Params->MarshalMethod]);
        fprintf(stderr, "Param -   FirstTimestepPrecious=%s\n",
                Params->FirstTimestepPrecious ? "True" : "False");
        fprintf(stderr, "Param -   IsRowMajor=%d  (not user settable) \n", Params->IsRowMajor);
    }
    if (ReaderSide)
    {
        fprintf(stderr, "Param -   AlwaysProvideLatestTimestep=%s\n",
                Params->AlwaysProvideLatestTimestep ? "True" : "False");
    }
    fprintf(stderr, "Param -   OpenTimeoutSecs=%d (seconds)\n", Params->OpenTimeoutSecs);
    fprintf(stderr, "Param -   SpeculativePreloadMode=%s\n",
            SstPreloadModeStr[Params->SpeculativePreloadMode]);
    fprintf(stderr, "Param -   SpecAutoNodeThreshold=%d\n", Params->SpecAutoNodeThreshold);
    fprintf(stderr, "Param -   ControlModule=%s\n",
            Params->ControlModule ? Params->ControlModule : " (default - Advanced param)");
}